

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

bool __thiscall Potassco::AspifTextInput::doAttach(AspifTextInput *this,bool *inc)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  
  bVar1 = ProgramReader::peek(&this->super_ProgramReader,true);
  if ((this->out_ == (AbstractProgram *)0x0) ||
     (((bVar1 != 0 && (iVar4 = islower((uint)bVar1), iVar4 == 0)) &&
      (pvVar5 = memchr(".#%{:",(int)(char)bVar1,6), pvVar5 == (void *)0x0)))) {
    bVar2 = false;
  }
  else {
    while (bVar1 == 0x25) {
      ProgramReader::skipLine(&this->super_ProgramReader);
      bVar1 = ProgramReader::peek(&this->super_ProgramReader,true);
    }
    bVar3 = false;
    bVar2 = match(this,"#incremental",false);
    if (bVar2) {
      bVar2 = match(this,".",true);
      bVar3 = ProgramReader::require(&this->super_ProgramReader,bVar2,"unrecognized directive");
    }
    *inc = bVar3;
    (*this->out_->_vptr_AbstractProgram[2])(this->out_,(ulong)bVar3);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool AspifTextInput::doAttach(bool& inc) {
	char n = peek(true);
	if (out_ && (!n || std::islower(static_cast<unsigned char>(n)) || std::strchr(".#%{:", n))) {
		while (n == '%') {
			skipLine();
			n = peek(true);
		}
		inc = match("#incremental", false) && require(match("."), "unrecognized directive");
		out_->initProgram(inc);
		return true;
	}
	return false;
}